

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_> * __thiscall
vkb::Swapchain::get_image_views
          (Result<std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>_>
           *__return_storage_ptr__,Swapchain *this,void *pNext)

{
  pointer ppVVar1;
  VkResult VVar2;
  vector<VkImage_T_*,_std::allocator<VkImage_T_*>_> *pvVar3;
  long lVar4;
  ulong uVar5;
  error_code eVar6;
  vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_> views;
  VkImageViewUsageCreateInfo desired_flags;
  VkImageViewCreateInfo local_a8;
  Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_> swapchain_images_ret;
  
  get_images(&swapchain_images_ret,this);
  if (swapchain_images_ret.m_init == false) {
    eVar6 = Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>::error
                      (&swapchain_images_ret);
    (__return_storage_ptr__->field_0).m_error.type._M_value = eVar6._M_value;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)eVar6._M_cat;
    (__return_storage_ptr__->field_0).m_error.vk_result = VK_SUCCESS;
    __return_storage_ptr__->m_init = false;
  }
  else {
    pvVar3 = Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>::value
                       (&swapchain_images_ret);
    for (; ((VkImageViewUsageCreateInfo *)pNext != (VkImageViewUsageCreateInfo *)0x0 &&
           (((VkImageViewUsageCreateInfo *)pNext)->sType != VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO
           )); pNext = ((VkImageViewUsageCreateInfo *)pNext)->pNext) {
    }
    desired_flags.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_USAGE_CREATE_INFO;
    desired_flags._4_4_ = 0;
    desired_flags._20_4_ = 0;
    desired_flags.usage = this->image_usage_flags;
    desired_flags.pNext = pNext;
    std::vector<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::vector
              (&views,(long)(pvVar3->super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pvVar3->super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>).
                            _M_impl.super__Vector_impl_data._M_start >> 3,
               (allocator_type *)&local_a8);
    lVar4 = 0;
    for (uVar5 = 0;
        ppVVar1 = (pvVar3->super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>)._M_impl.
                  super__Vector_impl_data._M_start,
        uVar5 < (ulong)((long)(pvVar3->super__Vector_base<VkImage_T_*,_std::allocator<VkImage_T_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3);
        uVar5 = uVar5 + 1) {
      local_a8.flags = 0;
      local_a8._20_4_ = 0;
      local_a8.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
      local_a8._4_4_ = 0;
      local_a8.pNext = &desired_flags;
      if (this->instance_version < 0x401000) {
        local_a8.pNext = pNext;
      }
      if ((VkImageViewUsageCreateInfo *)pNext != (VkImageViewUsageCreateInfo *)0x0) {
        local_a8.pNext = pNext;
      }
      local_a8.image = *(VkImage *)((long)ppVVar1 + lVar4);
      local_a8.format = this->image_format;
      local_a8.viewType = VK_IMAGE_VIEW_TYPE_2D;
      local_a8.components.r = VK_COMPONENT_SWIZZLE_IDENTITY;
      local_a8.components.g = VK_COMPONENT_SWIZZLE_IDENTITY;
      local_a8.components.b = VK_COMPONENT_SWIZZLE_IDENTITY;
      local_a8.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
      local_a8.subresourceRange.aspectMask = 1;
      local_a8.subresourceRange.baseMipLevel = 0;
      local_a8.subresourceRange.levelCount = 1;
      local_a8.subresourceRange.baseArrayLayer = 0;
      local_a8.subresourceRange.layerCount = 1;
      local_a8._76_4_ = 0;
      VVar2 = (*(this->internal_table).fp_vkCreateImageView)
                        (this->device,&local_a8,this->allocation_callbacks,
                         (VkImageView *)
                         ((long)views.
                                super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>
                                ._M_impl.super__Vector_impl_data._M_start + lVar4));
      if (VVar2 != VK_SUCCESS) {
        (__return_storage_ptr__->field_0).m_error.type._M_value = 4;
        (__return_storage_ptr__->field_0).m_value.
        super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)&detail::swapchain_error_category;
        (__return_storage_ptr__->field_0).m_error.vk_result = VVar2;
        __return_storage_ptr__->m_init = false;
        goto LAB_00107a72;
      }
      lVar4 = lVar4 + 8;
    }
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         views.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         views.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->field_0).m_value.
    super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         views.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    views.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    views.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    views.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->m_init = true;
LAB_00107a72:
    std::_Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>::~_Vector_base
              (&views.super__Vector_base<VkImageView_T_*,_std::allocator<VkImageView_T_*>_>);
  }
  Result<std::vector<VkImage_T_*,_std::allocator<VkImage_T_*>_>_>::destroy(&swapchain_images_ret);
  return __return_storage_ptr__;
}

Assistant:

Result<std::vector<VkImageView>> Swapchain::get_image_views(const void* pNext) {
    const auto swapchain_images_ret = get_images();
    if (!swapchain_images_ret) return swapchain_images_ret.error();
    const auto& swapchain_images = swapchain_images_ret.value();

    bool already_contains_image_view_usage = false;
    while (pNext) {
        if (reinterpret_cast<const VkBaseInStructure*>(pNext)->sType == VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO) {
            already_contains_image_view_usage = true;
            break;
        }
        pNext = reinterpret_cast<const VkBaseInStructure*>(pNext)->pNext;
    }
    VkImageViewUsageCreateInfo desired_flags{};
    desired_flags.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_USAGE_CREATE_INFO;
    desired_flags.pNext = pNext;
    desired_flags.usage = image_usage_flags;

    std::vector<VkImageView> views(swapchain_images.size());
    for (size_t i = 0; i < swapchain_images.size(); i++) {
        VkImageViewCreateInfo createInfo = {};
        createInfo.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
        if (instance_version >= VKB_VK_API_VERSION_1_1 && !already_contains_image_view_usage) {
            createInfo.pNext = &desired_flags;
        } else {
            createInfo.pNext = pNext;
        }

        createInfo.image = swapchain_images[i];
        createInfo.viewType = VK_IMAGE_VIEW_TYPE_2D;
        createInfo.format = image_format;
        createInfo.components.r = VK_COMPONENT_SWIZZLE_IDENTITY;
        createInfo.components.g = VK_COMPONENT_SWIZZLE_IDENTITY;
        createInfo.components.b = VK_COMPONENT_SWIZZLE_IDENTITY;
        createInfo.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
        createInfo.subresourceRange.aspectMask = VK_IMAGE_ASPECT_COLOR_BIT;
        createInfo.subresourceRange.baseMipLevel = 0;
        createInfo.subresourceRange.levelCount = 1;
        createInfo.subresourceRange.baseArrayLayer = 0;
        createInfo.subresourceRange.layerCount = 1;
        VkResult res = internal_table.fp_vkCreateImageView(device, &createInfo, allocation_callbacks, &views[i]);
        if (res != VK_SUCCESS) return Error{ SwapchainError::failed_create_swapchain_image_views, res };
    }
    return views;
}